

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
          (MultiAgentDecisionProcessDiscrete *this,string *name,string *descr,string *pf)

{
  undefined8 *in_RDI;
  string *in_stack_00000010;
  string *in_stack_00000018;
  string *in_stack_00000020;
  void **in_stack_00000028;
  MultiAgentDecisionProcess *in_stack_00000030;
  MADPComponentDiscreteActions *this_00;
  
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)(in_RDI + 0x40));
  in_RDI[0x40] = 0;
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0x40),&PTR_PTR_00d36168);
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000010);
  *in_RDI = 0xd35cd0;
  in_RDI[0x40] = 0xd35fc8;
  in_RDI[0x40] = 0xd35fc8;
  this_00 = (MADPComponentDiscreteActions *)(in_RDI + 0x19);
  MADPComponentDiscreteStates::MADPComponentDiscreteStates((MADPComponentDiscreteStates *)this_00);
  MADPComponentDiscreteActions::MADPComponentDiscreteActions(this_00);
  MADPComponentDiscreteObservations::MADPComponentDiscreteObservations
            ((MADPComponentDiscreteObservations *)this_00);
  *(undefined1 *)(in_RDI + 0x3c) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e1) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e2) = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  *(undefined4 *)(in_RDI + 0x3f) = 0xffffffff;
  return;
}

Assistant:

MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete( 
    const string &name, const string &descr, const string &pf) :
    MultiAgentDecisionProcessDiscreteInterface(),
    MultiAgentDecisionProcess(name, descr, pf)
{
    _m_initialized = false;
    _m_sparse = false;
    _m_eventObservability = false;
    _m_p_tModel = 0;
    _m_p_oModel = 0;
    _m_falseNegativeObs = -1;
}